

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolBuilders.cpp
# Opt level: O0

void __thiscall
slang::ast::MethodBuilder::MethodBuilder
          (MethodBuilder *this,Compilation *compilation,string_view name,Type *returnType,
          SubroutineKind kind)

{
  SubroutineSymbol *pSVar1;
  BumpAllocator *in_RDX;
  basic_string_view<char,_std::char_traits<char>_> *in_RSI;
  Compilation *in_RDI;
  Type *in_R8;
  uint in_R9D;
  bitmask<slang::ast::MethodFlags> local_3e [3];
  SubroutineKind *in_stack_ffffffffffffffc8;
  
  (in_RDI->super_BumpAllocator).head = (Segment *)in_RSI;
  pSVar1 = BumpAllocator::
           emplace<slang::ast::SubroutineSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation_const&,slang::ast::VariableLifetime,slang::ast::SubroutineKind&>
                     (in_RDX,in_RDI,in_RSI,(SourceLocation *)in_R8,
                      (VariableLifetime *)((ulong)in_R9D << 0x20),in_stack_ffffffffffffffc8);
  (in_RDI->super_BumpAllocator).endPtr = (byte *)pSVar1;
  SmallVector<const_slang::ast::FormalArgumentSymbol_*,_5UL>::SmallVector
            ((SmallVector<const_slang::ast::FormalArgumentSymbol_*,_5UL> *)0x52c936);
  DeclaredType::setType((DeclaredType *)((in_RDI->super_BumpAllocator).endPtr + 0x78),in_R8);
  bitmask<slang::ast::MethodFlags>::bitmask(local_3e,BuiltIn);
  *(underlying_type *)((in_RDI->super_BumpAllocator).endPtr + 0xc4) = local_3e[0].m_bits;
  return;
}

Assistant:

MethodBuilder::MethodBuilder(Compilation& compilation, std::string_view name,
                             const Type& returnType, SubroutineKind kind) :
    compilation(compilation),
    symbol(*compilation.emplace<SubroutineSymbol>(compilation, name, NL,
                                                  VariableLifetime::Automatic, kind)) {
    symbol.declaredReturnType.setType(returnType);
    symbol.flags = MethodFlags::BuiltIn;
}